

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *ws)

{
  ZSTD_cwksp *ws_local;
  
  if (ws->tableValidEnd < ws->tableEnd) {
    ws->tableValidEnd = ws->tableEnd;
  }
  ZSTD_cwksp_assert_internal_consistency(ws);
  return;
}

Assistant:

MEM_STATIC void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp* ws) {
    DEBUGLOG(4, "cwksp: ZSTD_cwksp_mark_tables_clean");
    assert(ws->tableValidEnd >= ws->objectEnd);
    assert(ws->tableValidEnd <= ws->allocStart);
    if (ws->tableValidEnd < ws->tableEnd) {
        ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
}